

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::setTime(DateTimePicker *this,QTime *time)

{
  DateTimePickerPrivate *this_00;
  QDate QVar1;
  char cVar2;
  QDateTime local_20 [8];
  
  cVar2 = QTime::isValid();
  if (cVar2 != '\0') {
    this_00 = (this->d).d;
    QVar1.jd = QDateTime::date();
    QDateTime::QDateTime(local_20,QVar1,(QTime)time->mds,((this->d).d)->spec,0);
    DateTimePickerPrivate::setValue(this_00,local_20,true);
    QDateTime::~QDateTime(local_20);
  }
  return;
}

Assistant:

void
DateTimePicker::setTime( const QTime & time )
{
	if( time.isValid() )
		d->setValue( QDateTime( d->value.date(), time, d->spec ) );
}